

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_in_out.cpp
# Opt level: O0

OperatorFinalizeResultType
ThrottlingSum::Finalize(ExecutionContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  DataChunk *in_RDX;
  bool bVar4;
  ThrottlingSumLocalData *local_state;
  size_type in_stack_ffffffffffffff68;
  LocalTableFunctionState *in_stack_ffffffffffffff70;
  Value local_68 [64];
  ThrottlingSumLocalData *local_28;
  DataChunk *local_20;
  
  local_20 = in_RDX;
  duckdb::optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->
            ((optional_ptr<duckdb::LocalTableFunctionState,_true> *)in_stack_ffffffffffffff70);
  local_28 = duckdb::LocalTableFunctionState::Cast<ThrottlingSum::ThrottlingSumLocalData>
                       (in_stack_ffffffffffffff70);
  uVar1 = local_28->current_idx;
  sVar2 = Catch::clara::std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)&local_28->row_sums);
  bVar4 = sVar2 <= uVar1;
  if (!bVar4) {
    duckdb::DataChunk::SetCardinality(local_20,1);
    local_28->current_idx = local_28->current_idx + 1;
    pvVar3 = duckdb::vector<int,_true>::operator[]
                       ((vector<int,_true> *)local_20,in_stack_ffffffffffffff68);
    duckdb::Value::Value(local_68,*pvVar3);
    duckdb::DataChunk::SetValue((ulong)local_20,0,(Value *)0x0);
    duckdb::Value::~Value(local_68);
  }
  return bVar4;
}

Assistant:

static OperatorFinalizeResultType Finalize(ExecutionContext &context, TableFunctionInput &data_p,
	                                           DataChunk &output) {
		auto &local_state = data_p.local_state->Cast<ThrottlingSum::ThrottlingSumLocalData>();

		if (local_state.current_idx < local_state.row_sums.size()) {
			output.SetCardinality(1);
			output.SetValue(0, 0, Value(local_state.row_sums[local_state.current_idx++]));
			return OperatorFinalizeResultType::HAVE_MORE_OUTPUT;
		} else {
			return OperatorFinalizeResultType::FINISHED;
		}
	}